

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O1

Statement *
slang::ast::DisableStatement::fromSyntax
          (Compilation *comp,DisableStatementSyntax *syntax,ASTContext *context)

{
  bool bVar1;
  Expression *this;
  Symbol *pSVar2;
  DisableStatement *pDVar3;
  Statement *pSVar4;
  SourceRange sourceRange;
  SourceRange local_30;
  
  this = ArbitrarySymbolExpression::fromSyntax
                   (comp,(syntax->name).ptr,context,(bitmask<slang::ast::LookupFlags>)0x0);
  bVar1 = Expression::bad(this);
  if (!bVar1) {
    pSVar2 = Expression::getSymbolReference(this,true);
    if ((pSVar2->kind == StatementBlock) ||
       ((pSVar2->kind == Subroutine && (*(int *)((long)&pSVar2[2].originatingSyntax + 4) == 1)))) {
      local_30 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pDVar3 = BumpAllocator::
               emplace<slang::ast::DisableStatement,slang::ast::Expression&,slang::SourceRange>
                         (&comp->super_BumpAllocator,this,&local_30);
      return &pDVar3->super_Statement;
    }
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)(syntax->name).ptr);
    ASTContext::addDiag(context,(DiagCode)0x230008,sourceRange);
  }
  pSVar4 = Statement::badStmt(comp,(Statement *)0x0);
  return pSVar4;
}

Assistant:

Statement& DisableStatement::fromSyntax(Compilation& comp, const DisableStatementSyntax& syntax,
                                        const ASTContext& context) {
    auto& targetExpr = ArbitrarySymbolExpression::fromSyntax(comp, *syntax.name, context);
    if (targetExpr.bad())
        return badStmt(comp, nullptr);

    auto symbol = targetExpr.getSymbolReference();
    SLANG_ASSERT(symbol);

    if (symbol->kind != SymbolKind::StatementBlock &&
        (symbol->kind != SymbolKind::Subroutine ||
         symbol->as<SubroutineSymbol>().subroutineKind != SubroutineKind::Task)) {
        context.addDiag(diag::InvalidDisableTarget, syntax.name->sourceRange());
        return badStmt(comp, nullptr);
    }

    return *comp.emplace<DisableStatement>(targetExpr, syntax.sourceRange());
}